

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::reDim(SPxBasisBase<double> *this)

{
  int iVar1;
  int iVar2;
  Verbosity VVar3;
  SPxBasisBase<double> *in_RDI;
  Verbosity old_verbosity;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  SPxOut *in_stack_ffffffffffffffc0;
  DataArray<soplex::SPxId> *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  Desc *this_01;
  undefined4 local_10;
  Verbosity local_c [3];
  
  SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[68],_bool_&,_bool_&,_0>
            (in_RDI,(char (*) [68])
                    "DCHBAS01 SPxBasisBase<R>::reDim(): matrixIsSetup={}, factorized={}\n",
             &in_RDI->matrixIsSetup,&in_RDI->factorized);
  this_01 = &in_RDI->thedesc;
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x26a15a);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x26a16e);
  Desc::reSize(this_01,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (int)in_stack_ffffffffffffffc8);
  iVar1 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x26a18c);
  iVar2 = DataArray<const_soplex::SVectorBase<double>_*>::size(&in_RDI->matrix);
  if (iVar1 != iVar2) {
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar3 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar3)) {
      local_c[0] = SPxOut::getVerbosity(in_RDI->spxout);
      local_10 = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_10);
      soplex::operator<<(in_stack_ffffffffffffffc0,
                         (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      soplex::operator<<(in_stack_ffffffffffffffc0,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_c);
    }
    this_00 = (DataArray<soplex::SPxId> *)&in_RDI->matrix;
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x26a26b);
    DataArray<const_soplex::SVectorBase<double>_*>::reSize
              ((DataArray<const_soplex::SVectorBase<double>_*> *)this_00,in_stack_ffffffffffffffbc);
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x26a291);
    DataArray<soplex::SPxId>::reSize(this_00,in_stack_ffffffffffffffbc);
    in_RDI->matrixIsSetup = false;
    in_RDI->factorized = false;
  }
  SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[72],_bool_&,_bool_&,_0>
            (in_RDI,(char (*) [72])
                    "DCHBAS03 SPxBasisBase<R>::reDim(): --> matrixIsSetup={}, factorized={}\n",
             &in_RDI->matrixIsSetup,&in_RDI->factorized);
  return;
}

Assistant:

void SPxBasisBase<R>::reDim()
{

   assert(theLP != nullptr);

   SPxOut::debug(this, "DCHBAS01 SPxBasisBase<R>::reDim(): matrixIsSetup={}, factorized={}\n",
                 matrixIsSetup, factorized);

   thedesc.reSize(theLP->nRows(), theLP->nCols());

   if(theLP->dim() != matrix.size())
   {
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                    "ICHBAS02 basis redimensioning invalidates factorization"
                    << std::endl;)

      matrix.reSize(theLP->dim());
      theBaseId.reSize(theLP->dim());
      matrixIsSetup = false;
      factorized    = false;
   }

   SPxOut::debug(this, "DCHBAS03 SPxBasisBase<R>::reDim(): --> matrixIsSetup={}, factorized={}\n",
                 matrixIsSetup, factorized);

   assert(matrix.size()    >= theLP->dim());
   assert(theBaseId.size() >= theLP->dim());
}